

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_generic_expt(sexp ctx,sexp x,sexp_sint_t e)

{
  bool bVar1;
  sexp tmp;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_48;
  sexp local_40;
  sexp_gc_var_t local_38;
  sexp_gc_var_t local_28;
  
  local_28.var = &local_48;
  local_38.var = &local_40;
  local_28.next = &local_38;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_28.next;
  (ctx->value).context.saves = &local_28;
  local_40 = (sexp)&DAT_00000003;
  local_48 = x;
  if (0 < e) {
    do {
      if ((e & 1U) != 0) {
        local_40 = sexp_mul(ctx,local_40,local_48);
      }
      local_48 = sexp_mul(ctx,local_48,local_48);
      bVar1 = 1 < (ulong)e;
      e = (ulong)e >> 1;
    } while (bVar1);
  }
  (ctx->value).context.saves = local_38.next;
  return local_40;
}

Assistant:

sexp sexp_generic_expt (sexp ctx, sexp x, sexp_sint_t e) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  for (res = SEXP_ONE, tmp = x; e > 0; e >>= 1) {
    if (e&1) res = sexp_mul(ctx, res, tmp);
    tmp = sexp_mul(ctx, tmp, tmp);
  }
  sexp_gc_release2(ctx);
  return res;
}